

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::initFactorMatrix(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         **vec,
                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *eps)

{
  long lVar1;
  bool bVar2;
  type_conflict5 tVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  int __c;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c_00;
  ulong extraout_RDX;
  long in_RSI;
  undefined4 *in_RDI;
  int j_3;
  int k_1;
  int end;
  int j_2;
  int j_1;
  int nnonzeros;
  int i_3;
  int i_2;
  int j;
  int k;
  int i_1;
  int i;
  int *sing;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *psv;
  Dring *lastcring;
  Dring *cring;
  Dring *lastrring;
  Dring *rring;
  int tot;
  int m;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  uint in_stack_fffffffffffff3c8;
  int in_stack_fffffffffffff3cc;
  int in_stack_fffffffffffff3d0;
  undefined4 in_stack_fffffffffffff3d4;
  undefined1 local_bfc [128];
  undefined1 local_b7c [68];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff4c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff4d0;
  undefined1 local_afc [256];
  undefined1 local_9fc [128];
  undefined1 local_97c [128];
  uint local_8fc;
  int local_8f8;
  int local_8f4;
  undefined1 local_8f0 [128];
  undefined1 local_870 [88];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff7e8;
  int in_stack_fffffffffffff7f4;
  int in_stack_fffffffffffff7f8;
  int in_stack_fffffffffffff7fc;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff800;
  undefined1 local_7f0 [128];
  undefined1 local_770 [256];
  undefined1 local_670 [128];
  undefined1 local_5f0 [128];
  uint local_570;
  undefined1 local_56c [128];
  undefined1 local_4ec [128];
  int local_46c;
  int local_468;
  int local_464;
  undefined4 local_460;
  int local_45c;
  undefined1 local_458 [128];
  undefined1 local_3d8 [128];
  undefined1 local_358 [128];
  uint local_2d8;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  long local_2c8;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2c0;
  long *local_2b8;
  long *local_2b0;
  long *local_2a8;
  long *local_2a0;
  int local_298;
  int local_294;
  undefined1 local_290 [136];
  long local_208;
  undefined1 *local_1f8;
  undefined4 *local_1f0;
  undefined4 *local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined4 *local_128;
  undefined1 *local_120;
  undefined4 *local_118;
  undefined1 *local_110;
  reference local_108;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  undefined1 *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  undefined4 *local_e0;
  long local_d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c9;
  int *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  int *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  long local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  int *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  int *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  int *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  ulong uVar8;
  
  local_1f8 = local_290;
  local_208 = in_RSI;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0));
  local_2c8 = *(long *)(in_RDI + 0x10e);
  for (local_2cc = 0; local_2cc < (int)in_RDI[1]; local_2cc = local_2cc + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 0xe8) + (long)local_2cc * 4) = 0;
    *(undefined4 *)(*(long *)(in_RDI + 0xea) + (long)local_2cc * 4) = 0;
  }
  local_298 = 0;
  for (local_2d0 = 0; local_2d0 < (int)in_RDI[1]; local_2d0 = local_2d0 + 1) {
    local_2c0 = *(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(local_208 + (long)local_2d0 * 8);
    local_2d4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(local_2c0);
    if (local_2d4 < 2) {
      if (local_2d4 == 0) {
        *in_RDI = 2;
        return;
      }
    }
    else {
      local_298 = local_2d4 + local_298;
      uVar8 = extraout_RDX;
      for (local_2d8 = 0; (int)local_2d8 < local_2d4; local_2d8 = local_2d8 + 1) {
        lVar1 = *(long *)(in_RDI + 0xea);
        pcVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::index(local_2c0,(char *)(ulong)local_2d8,(int)uVar8);
        uVar7 = *(int *)(lVar1 + (long)(int)pcVar6 * 4) + 1;
        uVar8 = (ulong)uVar7;
        *(uint *)(lVar1 + (long)(int)pcVar6 * 4) = uVar7;
      }
    }
  }
  local_30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(in_RDI + 0x43);
  local_28 = local_358;
  local_38 = &local_298;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,local_30);
  local_20 = local_358;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0));
  local_8 = local_358;
  local_10 = local_30;
  local_18 = local_38;
  local_48 = (long)*local_38;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8),(longlong *)0x6d334d);
  boost::multiprecision::number::operator_cast_to_int
            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)0x6d335a);
  minRowMem((CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
            in_stack_fffffffffffff3cc);
  local_78 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(in_RDI + 99);
  local_70 = local_3d8;
  local_80 = &local_298;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_81,local_78);
  local_68 = local_3d8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0));
  local_50 = local_3d8;
  local_58 = local_78;
  local_60 = local_80;
  local_90 = (long)*local_80;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8),(longlong *)0x6d342b);
  boost::multiprecision::number::operator_cast_to_int
            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)0x6d3438);
  minColMem((CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
            in_stack_fffffffffffff3cc);
  local_c0 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(in_RDI + 0x83);
  local_b8 = local_458;
  local_c8 = &local_298;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_c9,local_c0);
  local_b0 = local_458;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0));
  local_98 = local_458;
  local_a0 = local_c0;
  local_a8 = local_c8;
  local_d8 = (long)*local_c8;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8),(longlong *)0x6d3509);
  boost::multiprecision::number::operator_cast_to_int
            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)0x6d3516);
  minLMem((CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),in_stack_fffffffffffff3cc
         );
  **(undefined4 **)(in_RDI + 0xe6) = 0;
  local_2a0 = *(long **)(in_RDI + 0xda);
  local_2a8 = (long *)(in_RDI + 0xd4);
  in_RDI[0xd8] = in_RDI[1];
  *local_2a8 = (long)local_2a0;
  local_2b0 = *(long **)(in_RDI + 0xf2);
  local_2b8 = (long *)(in_RDI + 0xec);
  in_RDI[0xf0] = in_RDI[1];
  *local_2b8 = (long)local_2b0;
  local_294 = 0;
  for (local_45c = 0; local_45c < (int)in_RDI[1]; local_45c = local_45c + 1) {
    *(int *)(*(long *)(in_RDI + 0xe6) + (long)local_45c * 4) = local_294;
    local_294 = *(int *)(*(long *)(in_RDI + 0xea) + (long)local_45c * 4) + local_294;
    *(int *)(local_2a0 + 2) = local_45c;
    local_2a0[1] = (long)local_2a8;
    *local_2a8 = (long)local_2a0;
    local_2a8 = local_2a0;
    local_2a0 = local_2a0 + 3;
    *(int *)(local_2b0 + 2) = local_45c;
    local_2b0[1] = (long)local_2b8;
    *local_2b8 = (long)local_2b0;
    local_2b8 = local_2b0;
    local_2b0 = local_2b0 + 3;
  }
  *(undefined4 *)(*(long *)(in_RDI + 0xe6) + (long)(int)in_RDI[1] * 4) = 0;
  *(undefined4 *)(*(long *)(in_RDI + 0xea) + (long)(int)in_RDI[1] * 4) = 0;
  in_RDI[0xdd] = local_294;
  *local_2a8 = (long)(in_RDI + 0xd4);
  *(long **)(*local_2a8 + 8) = local_2a8;
  *local_2b8 = (long)(in_RDI + 0xec);
  *(long **)(*local_2b8 + 8) = local_2b8;
  local_294 = 0;
  in_RDI[0x118] = 0;
  local_460 = 0;
  local_1e8 = in_RDI + 3;
  local_1f0 = &local_460;
  local_e0 = local_1f0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
             CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
  local_464 = 0;
  while( true ) {
    if ((int)in_RDI[1] <= local_464) {
      in_RDI[0xf5] = local_294;
      return;
    }
    local_2c0 = *(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(local_208 + (long)local_464 * 8);
    *(int *)(*(long *)(in_RDI + 0xfe) + (long)local_464 * 4) = local_294;
    local_468 = 0;
    for (local_46c = 0; iVar5 = local_46c,
        iVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(local_2c0), iVar5 < iVar4 && local_468 < 2; local_46c = local_46c + 1) {
      local_1e0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::value(local_2c0,local_46c);
      local_1d8 = local_4ec;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
      local_1c8 = local_56c;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
      bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
      if (bVar2) {
        local_468 = local_468 + 1;
      }
    }
    if (local_468 == 0) break;
    if (local_468 == 1) {
      local_570 = 0;
      while( true ) {
        local_1c0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::value(local_2c0,local_570);
        local_1b8 = local_5f0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
        local_1a8 = local_670;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
        bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
        if (!bVar2) break;
        local_570 = local_570 + 1;
      }
      lVar1 = *(long *)(in_RDI + 0xa6);
      pcVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::index(local_2c0,(char *)(ulong)local_570,__c);
      if (-1 < *(int *)(lVar1 + (long)(int)pcVar6 * 4)) {
        *in_RDI = 2;
        return;
      }
      local_f0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::value(local_2c0,local_570);
      local_e8 = local_290;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
      local_198 = local_770;
      local_1a0 = local_290;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6d3b20);
      iVar5 = extraout_EDX;
      if (tVar3) {
        local_188 = local_870;
        local_190 = local_290;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
        spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
        local_118 = in_RDI + 3;
        local_120 = local_7f0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
        iVar5 = extraout_EDX_00;
      }
      in_stack_fffffffffffff3cc = in_RDI[0x118];
      in_stack_fffffffffffff3d0 = local_464;
      pcVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::index(local_2c0,(char *)(ulong)local_570,iVar5);
      in_stack_fffffffffffff3d4 = SUB84(pcVar6,0);
      local_178 = local_8f0;
      local_180 = local_290;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
      setPivot(in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8,
               in_stack_fffffffffffff7f4,in_stack_fffffffffffff7e8);
      *(int *)(local_2c8 + (long)(int)in_RDI[0x118] * 4) = local_464;
      in_RDI[0x118] = in_RDI[0x118] + 1;
      *(undefined4 *)(*(long *)(in_RDI + 0x102) + (long)local_464 * 4) = 0;
      *(undefined4 *)(*(long *)(in_RDI + 0x100) + (long)local_464 * 4) = 0;
      *(undefined4 *)(*(long *)(in_RDI + 0x116) + (long)local_464 * 4) = 0;
    }
    else {
      local_468 = 0;
      local_8fc = 0;
      while (in_stack_fffffffffffff3c8 = local_8fc,
            iVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(local_2c0), (int)in_stack_fffffffffffff3c8 < iVar5) {
        local_100 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::value(local_2c0,local_8fc);
        local_f8 = local_290;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
        local_168 = local_97c;
        local_170 = local_290;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
        local_158 = local_9fc;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
        bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
        if (bVar2) {
          pcVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::index(local_2c0,(char *)(ulong)local_8fc,__c_00);
          local_8f8 = (int)pcVar6;
          *(int *)(*(long *)(in_RDI + 0xf6) + (long)local_294 * 4) = local_8f8;
          local_294 = local_294 + 1;
          local_8f4 = *(int *)(*(long *)(in_RDI + 0xe6) + (long)local_8f8 * 4) +
                      *(int *)(*(long *)(in_RDI + 0xe8) + (long)local_8f8 * 4);
          *(int *)(*(long *)(in_RDI + 0xe4) + (long)local_8f4 * 4) = local_464;
          local_108 = std::
                      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)(in_RDI + 0xde),(long)local_8f4);
          local_110 = local_290;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
          *(int *)(*(long *)(in_RDI + 0xe8) + (long)local_8f8 * 4) =
               *(int *)(*(long *)(in_RDI + 0xe8) + (long)local_8f8 * 4) + 1;
          local_148 = local_afc;
          local_150 = local_290;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
          spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8),
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x6d3ef2);
          if (tVar3) {
            local_138 = local_bfc;
            local_140 = local_290;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
            spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
            local_128 = in_RDI + 3;
            local_130 = local_b7c;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
          }
          local_468 = local_468 + 1;
        }
        local_8fc = local_8fc + 1;
      }
      *(int *)(*(long *)(in_RDI + 0x102) + (long)local_464 * 4) = local_468;
      *(int *)(*(long *)(in_RDI + 0x100) + (long)local_464 * 4) = local_468;
      *(int *)(*(long *)(in_RDI + 0x116) + (long)local_464 * 4) = local_468;
    }
    local_464 = local_464 + 1;
  }
  *in_RDI = 2;
  return;
}

Assistant:

void CLUFactor<R>::initFactorMatrix(const SVectorBase<R>** vec, const R eps)
{

   R x;
   int m;
   int tot;
   Dring* rring, *lastrring;
   Dring* cring, *lastcring;
   const SVectorBase<R>* psv;
   int* sing = temp.s_mark;

   /*  Initialize:
    *  - column file thereby remembering column singletons in |sing|.
    *  - nonzeros counts per row
    *  - total number of nonzeros
    */

   for(int i = 0; i < thedim; i++)
      u.row.max[i] = u.row.len[i] = 0;

   tot = 0;

   for(int i = 0; i < thedim; i++)
   {
      int k;

      psv = vec[i];
      k = psv->size();

      if(k > 1)
      {
         tot += k;

         for(int j = 0; j < k; ++j)
            u.row.max[psv->index(j)]++;
      }
      else if(k == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }
   }

   /*  Resize nonzero memory if necessary
    */
   minRowMem(int(rowMemMult * tot));

   minColMem(int(colMemMult * tot));

   minLMem(int(lMemMult * tot));


   /*  Initialize:
    *  - row ring lists
    *  - row vectors in file
    *  - column ring lists
    */
   u.row.start[0] = 0;

   rring = u.row.elem;

   lastrring = &(u.row.list);

   lastrring->idx = thedim;

   lastrring->next = rring;

   cring = u.col.elem;

   lastcring = &(u.col.list);

   lastcring->idx = thedim;

   lastcring->next = cring;

   m = 0;

   for(int i = 0; i < thedim; i++)
   {
      u.row.start[i] = m;
      m += u.row.max[i];

      rring->idx = i;
      rring->prev = lastrring;
      lastrring->next = rring;
      lastrring = rring;
      ++rring;

      cring->idx = i;
      cring->prev = lastcring;
      lastcring->next = cring;
      lastcring = cring;
      ++cring;
   }

   u.row.start[thedim]       = 0;

   u.row.max[thedim]       = 0;
   u.row.used = m;

   lastrring->next = &(u.row.list);
   lastrring->next->prev = lastrring;

   lastcring->next = &(u.col.list);
   lastcring->next->prev = lastcring;

   /*  Copy matrix to row and column file
    *  excluding and marking column singletons!
    */
   m = 0;
   temp.stage = 0;

   initMaxabs = 0;

   for(int i = 0; i < thedim; i++)
   {
      int nnonzeros;

      psv = vec[i];
      u.col.start[i] = m;

      /* check whether number of nonzeros above tolerance is 0, 1 or >= 2 */
      nnonzeros = 0;

      for(int j = 0; j < psv->size() && nnonzeros <= 1; j++)
      {
         if(isNotZero(psv->value(j), eps))
            nnonzeros++;
      }

      /* basis is singular due to empty column */
      if(nnonzeros == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }

      /* exclude column singletons */
      else if(nnonzeros == 1)
      {
         int j = 0;

         /* find nonzero */

         for(j = 0; isZero(psv->value(j), eps); j++)
            ;

         assert(j < psv->size());

         /* basis is singular due to two linearly dependent column singletons */
         if(row.perm[psv->index(j)] >= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         /* update maximum absolute nonzero value */
         x = psv->value(j);

         if(spxAbs(x) > initMaxabs)
            initMaxabs = spxAbs(x);

         /* permute to front and mark as singleton */
         setPivot(temp.stage, i, psv->index(j), x);

         sing[temp.stage] = i;

         temp.stage++;

         /* set column length to zero */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = 0;
      }

      /* add to active matrix if not a column singleton */
      else
      {
         int end;
         int k;

         /* go through all nonzeros in column */
         assert(nnonzeros >= 2);
         nnonzeros = 0;

         for(int j = 0; j < psv->size(); j++)
         {
            x = psv->value(j);

            if(isNotZero(x, eps))
            {
               /* add to column array */
               k = psv->index(j);
               u.col.idx[m] = k;
               m++;

               /* add to row array */
               end = u.row.start[k] + u.row.len[k];
               u.row.idx[end] = i;
               u.row.val[end] = x;
               u.row.len[k]++;

               /* update maximum absolute nonzero value */

               if(spxAbs(x) > initMaxabs)
                  initMaxabs = spxAbs(x);

               nnonzeros++;
            }
         }

         assert(nnonzeros >= 2);

         /* set column length */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = nnonzeros;
      }
   }

   u.col.used = m;
}